

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<int,int,float>
               (ImGuiDataType data_type,int *v,float v_speed,int v_min,int v_max,char *format,
               ImGuiSliderFlags flags)

{
  bool bVar1;
  uint uVar2;
  float *pfVar3;
  float in_ECX;
  float in_EDX;
  float *in_RSI;
  int in_EDI;
  char *in_R8;
  uint in_R9D;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  float in_XMM0_Da;
  float fVar7;
  ImGuiDataType unaff_retaddr;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float v_old_ref_for_accum_remainder;
  int v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_logarithmic;
  bool is_clamped;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiContext *g;
  bool local_83;
  ImGuiInputReadMode in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff88;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined4 in_stack_ffffffffffffff8c;
  float local_5c;
  float local_58;
  ImVec2 in_stack_ffffffffffffffb0;
  float fVar10;
  ImGuiContext *pIVar11;
  int in_stack_ffffffffffffffd0;
  ImGuiDataType in_stack_ffffffffffffffe0;
  float in_stack_fffffffffffffffc;
  bool bVar12;
  
  uVar2 = (uint)((in_R9D & 0x100000) != 0);
  bVar4 = in_EDI == 8;
  bVar5 = in_EDI == 9;
  uVar9 = bVar4 || bVar5;
  bVar12 = (int)in_EDX < (int)in_ECX;
  bVar6 = (in_R9D & 0x20) != 0;
  uVar8 = bVar6 && (bool)uVar9;
  if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && (bVar12)) &&
     ((float)((int)in_ECX - (int)in_EDX) < 3.4028235e+38)) {
    in_XMM0_Da = (float)((int)in_ECX - (int)in_EDX) * GImGui->DragSpeedDefaultRatio;
  }
  fVar10 = 0.0;
  pIVar11 = GImGui;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar1 = IsMousePosValid((ImVec2 *)0x0), bVar1)) &&
     (bVar1 = IsMouseDragPastThreshold(0,(pIVar11->IO).MouseDragThreshold * 0.5), bVar1)) {
    pfVar3 = ImVec2::operator[](&(pIVar11->IO).MouseDelta,(long)(int)uVar2);
    fVar10 = *pfVar3;
    if (((pIVar11->IO).KeyAlt & 1U) != 0) {
      fVar10 = fVar10 * 0.01;
    }
    if (((pIVar11->IO).KeyShift & 1U) != 0) {
      fVar10 = fVar10 * 10.0;
    }
  }
  else if (pIVar11->ActiveIdSource == ImGuiInputSource_Nav) {
    if (bVar4 || bVar5) {
      in_stack_ffffffffffffff84 =
           ImParseFormatPrecision
                     ((char *)CONCAT44(in_stack_ffffffffffffff8c,
                                       CONCAT13(uVar9,CONCAT12(uVar8,in_stack_ffffffffffffff88))),
                      in_stack_ffffffffffffff84);
    }
    else {
      in_stack_ffffffffffffff84 = ImGuiInputReadMode_Down;
    }
    GetNavInputAmount2d((ImGuiNavDirSourceFlags)fVar10,in_stack_ffffffffffffff84,
                        in_stack_ffffffffffffffb0.y,in_stack_ffffffffffffffb0.x);
    pfVar3 = ImVec2::operator[]((ImVec2 *)&stack0xffffffffffffffb0,(long)(int)uVar2);
    fVar10 = *pfVar3;
    fVar7 = GetMinimumStepAtDecimalPrecision((int)in_XMM0_Da);
    in_XMM0_Da = ImMax<float>(in_XMM0_Da,fVar7);
  }
  fVar10 = in_XMM0_Da * fVar10;
  if (uVar2 == 1) {
    fVar10 = -fVar10;
  }
  if (((bVar6 && (bVar4 || bVar5)) && ((float)((int)in_ECX - (int)in_EDX) < 3.4028235e+38)) &&
     (1e-06 < (float)((int)in_ECX - (int)in_EDX))) {
    fVar10 = fVar10 / (float)((int)in_ECX - (int)in_EDX);
  }
  local_83 = false;
  if ((bVar12) && (((int)*in_RSI < (int)in_ECX || (local_83 = true, fVar10 <= 0.0)))) {
    local_83 = (int)*in_RSI <= (int)in_EDX && fVar10 < 0.0;
  }
  if (((pIVar11->ActiveIdIsJustActivated & 1U) != 0) || (local_83)) {
    pIVar11->DragCurrentAccum = 0.0;
    pIVar11->DragCurrentAccumDirty = false;
  }
  else if ((fVar10 != 0.0) || (NAN(fVar10))) {
    pIVar11->DragCurrentAccum = fVar10 + pIVar11->DragCurrentAccum;
    pIVar11->DragCurrentAccumDirty = true;
  }
  if ((pIVar11->DragCurrentAccumDirty & 1U) == 0) {
    bVar12 = false;
  }
  else {
    local_5c = 0.0;
    if (bVar6 && (bVar4 || bVar5)) {
      if (bVar4 || bVar5) {
        ImParseFormatPrecision
                  ((char *)CONCAT44(in_stack_ffffffffffffff8c,
                                    CONCAT13(uVar9,CONCAT12(uVar8,in_stack_ffffffffffffff88))),
                   in_stack_ffffffffffffff84);
      }
      ImPow(0.0,2.35632e-39);
      local_5c = ScaleRatioFromValueT<int,int,float>
                           (in_stack_ffffffffffffffe0,(int)((ulong)in_R8 >> 0x20),(int)in_R8,in_R9D,
                            SUB41((uint)in_stack_ffffffffffffffd0 >> 0x18,0),
                            (float)((ulong)pIVar11 >> 0x20),SUB84(pIVar11,0));
      local_58 = (float)ScaleValueFromRatioT<int,int,float>
                                  (unaff_retaddr,in_stack_fffffffffffffffc,in_EDI,
                                   (int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0),
                                   in_XMM0_Da,in_EDX);
    }
    else {
      local_58 = (float)((int)pIVar11->DragCurrentAccum + (int)*in_RSI);
    }
    if ((in_R9D & 0x40) == 0) {
      local_58 = (float)RoundScalarWithFormatT<int,int>(in_R8,in_R9D,in_stack_ffffffffffffffd0);
    }
    pIVar11->DragCurrentAccumDirty = false;
    if (bVar6 && (bVar4 || bVar5)) {
      fVar7 = ScaleRatioFromValueT<int,int,float>
                        (in_stack_ffffffffffffffe0,(int)((ulong)in_R8 >> 0x20),(int)in_R8,in_R9D,
                         SUB41((uint)in_stack_ffffffffffffffd0 >> 0x18,0),
                         (float)((ulong)pIVar11 >> 0x20),SUB84(pIVar11,0));
      pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum - (fVar7 - local_5c);
    }
    else {
      pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum - (float)((int)local_58 - (int)*in_RSI);
    }
    if (local_58 == 0.0) {
      local_58 = 0.0;
    }
    if ((*in_RSI != local_58) && (bVar12)) {
      if (((int)local_58 < (int)in_EDX) ||
         ((((int)*in_RSI < (int)local_58 && (fVar10 < 0.0)) && (!bVar4 && !bVar5)))) {
        local_58 = in_EDX;
      }
      if (((int)in_ECX < (int)local_58) ||
         ((((int)local_58 < (int)*in_RSI && (0.0 < fVar10)) && (!bVar4 && !bVar5)))) {
        local_58 = in_ECX;
      }
    }
    if (*in_RSI == local_58) {
      bVar12 = false;
    }
    else {
      *in_RSI = local_58;
      bVar12 = true;
    }
  }
  return bVar12;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}